

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O0

bool __thiscall
r_exec::HLPBindingMap::match_bwd_strict(HLPBindingMap *this,_Fact *f_object,_Fact *f_pattern)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar4;
  _Fact *f_pattern_local;
  _Fact *f_object_local;
  HLPBindingMap *this_local;
  
  iVar2 = (*(f_object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(f_object,0);
  iVar3 = (*(f_pattern->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(f_pattern,0);
  bVar1 = BindingMap::match_object
                    (&this->super_BindingMap,(Code *)CONCAT44(extraout_var,iVar2),
                     (Code *)CONCAT44(extraout_var_00,iVar3));
  if (bVar1) {
    iVar2 = (*(f_object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
              .super_Code.super__Object._vptr__Object[5])(f_object,0);
    iVar3 = (*(f_pattern->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
              super_LObject.super_Code.super__Object._vptr__Object[5])(f_pattern,0);
    uVar4 = r_code::Atom::operator!=
                      ((Atom *)CONCAT44(extraout_var_01,iVar2),
                       (Atom *)CONCAT44(extraout_var_02,iVar3));
    if ((uVar4 & 1) == 0) {
      this_local._7_1_ = match_bwd_timings(this,f_object,f_pattern);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HLPBindingMap::match_bwd_strict(const _Fact *f_object, const _Fact *f_pattern)
{
    if (match_object(f_object->get_reference(0), f_pattern->get_reference(0))) {
        if (f_object->code(0) != f_pattern->code(0)) {
            return false;
        }

        return match_bwd_timings(f_object, f_pattern);
    } else {
        return false;
    }
}